

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O0

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint16 value)

{
  undefined1 local_16;
  undefined1 local_15;
  ushort local_14;
  deUint16 local_12;
  deUint8 data [2];
  deUint16 val;
  SeedBuilder *pSStack_10;
  deUint16 value_local;
  SeedBuilder *builder_local;
  
  local_14 = value ^ 0x91cb;
  local_16 = (undefined1)local_14;
  local_15 = (undefined1)(local_14 >> 8);
  local_12 = value;
  pSStack_10 = builder;
  SeedBuilder::feed(builder,2,&local_16);
  return pSStack_10;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint16 value)
{
	const deUint16	val		= value ^ 37323u;
	const deUint8	data[]	=
	{
		(deUint8)(val & 0xFFu),
		(deUint8)(val >> 8),
	};

	builder.feed(sizeof(data), data);
	return builder;
}